

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-get-passwd.c
# Opt level: O3

int run_test_get_passwd(void)

{
  char **ppcVar1;
  int iVar2;
  int iVar3;
  int extraout_EAX;
  size_t sVar4;
  undefined8 uVar5;
  uv_getaddrinfo_t *puVar6;
  undefined4 *puVar7;
  int *piVar8;
  long extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  long extraout_RDX_02;
  char **unaff_RBX;
  size_t *psVar9;
  undefined8 *puVar10;
  int *piVar11;
  long lVar12;
  uv_passwd_t pwd;
  undefined1 auStack_248 [144];
  undefined8 uStack_1b8;
  char **ppcStack_1a8;
  char **ppcStack_1a0;
  char **ppcStack_198;
  undefined1 auStack_190 [144];
  undefined8 uStack_100;
  char **ppcStack_f0;
  code *pcStack_e8;
  undefined1 auStack_e0 [160];
  char **ppcStack_40;
  char *local_30;
  long local_28;
  long local_20;
  char *local_18;
  char **local_10;
  
  ppcStack_40 = (char **)0x15b407;
  iVar2 = uv_os_get_passwd(&local_30);
  ppcVar1 = local_10;
  if (iVar2 == 0) {
    if (*local_30 == '\0') goto LAB_0015b4cb;
    if (*local_18 == '\0') goto LAB_0015b4d0;
    ppcStack_40 = (char **)0x15b438;
    sVar4 = strlen((char *)local_10);
    unaff_RBX = ppcVar1;
    if (sVar4 != 1) {
      if (sVar4 != 0) {
        if (*(char *)((long)ppcVar1 + (sVar4 - 1)) == '/') {
          ppcStack_40 = (char **)0x15b453;
          run_test_get_passwd_cold_13();
          goto LAB_0015b453;
        }
        goto LAB_0015b45c;
      }
      goto LAB_0015b502;
    }
LAB_0015b453:
    if (*(char *)ppcVar1 == '/') {
LAB_0015b45c:
      if (local_28 < 0) goto LAB_0015b4d5;
      if (local_20 < 0) goto LAB_0015b4da;
      unaff_RBX = &local_30;
      ppcStack_40 = (char **)0x15b479;
      uv_os_free_passwd(unaff_RBX);
      if (local_30 != (char *)0x0) goto LAB_0015b4df;
      if (local_18 != (char *)0x0) goto LAB_0015b4e4;
      if (local_10 != (char **)0x0) goto LAB_0015b4e9;
      unaff_RBX = &local_30;
      ppcStack_40 = (char **)0x15b49c;
      uv_os_free_passwd(unaff_RBX);
      if (local_30 != (char *)0x0) goto LAB_0015b4ee;
      if (local_18 != (char *)0x0) goto LAB_0015b4f3;
      if (local_10 != (char **)0x0) goto LAB_0015b4f8;
      ppcStack_40 = (char **)0x15b4b9;
      iVar2 = uv_os_get_passwd(0);
      if (iVar2 == -0x16) {
        return 0;
      }
      goto LAB_0015b4fd;
    }
  }
  else {
    ppcStack_40 = (char **)0x15b4cb;
    run_test_get_passwd_cold_1();
LAB_0015b4cb:
    ppcStack_40 = (char **)0x15b4d0;
    run_test_get_passwd_cold_15();
LAB_0015b4d0:
    ppcStack_40 = (char **)0x15b4d5;
    run_test_get_passwd_cold_14();
LAB_0015b4d5:
    ppcStack_40 = (char **)0x15b4da;
    run_test_get_passwd_cold_4();
LAB_0015b4da:
    ppcStack_40 = (char **)0x15b4df;
    run_test_get_passwd_cold_5();
LAB_0015b4df:
    ppcStack_40 = (char **)0x15b4e4;
    run_test_get_passwd_cold_6();
LAB_0015b4e4:
    ppcStack_40 = (char **)0x15b4e9;
    run_test_get_passwd_cold_7();
LAB_0015b4e9:
    ppcStack_40 = (char **)0x15b4ee;
    run_test_get_passwd_cold_8();
LAB_0015b4ee:
    ppcStack_40 = (char **)0x15b4f3;
    run_test_get_passwd_cold_9();
LAB_0015b4f3:
    ppcStack_40 = (char **)0x15b4f8;
    run_test_get_passwd_cold_10();
LAB_0015b4f8:
    ppcStack_40 = (char **)0x15b4fd;
    run_test_get_passwd_cold_11();
LAB_0015b4fd:
    ppcStack_40 = (char **)0x15b502;
    run_test_get_passwd_cold_12();
LAB_0015b502:
    ppcStack_40 = (char **)0x15b507;
    run_test_get_passwd_cold_3();
  }
  ppcStack_40 = (char **)run_test_getaddrinfo_fail;
  run_test_get_passwd_cold_2();
  iVar2 = (int)auStack_e0;
  pcStack_e8 = (code *)0x15b519;
  ppcStack_40 = unaff_RBX;
  uVar5 = uv_default_loop();
  pcStack_e8 = (code *)0x15b533;
  iVar3 = uv_getaddrinfo(uVar5,auStack_e0,abort,0,0,0);
  if (iVar3 == -0x16) {
    pcStack_e8 = (code *)0x15b541;
    uVar5 = uv_default_loop();
    pcStack_e8 = (code *)0x15b560;
    iVar2 = (int)auStack_e0;
    iVar3 = uv_getaddrinfo(uVar5,auStack_e0,getaddrinfo_fail_cb,"xyzzy.xyzzy.xyzzy.",0,0);
    if (iVar3 != 0) goto LAB_0015b5c4;
    pcStack_e8 = (code *)0x15b569;
    uVar5 = uv_default_loop();
    iVar2 = 0;
    pcStack_e8 = (code *)0x15b573;
    iVar3 = uv_run(uVar5);
    if (iVar3 != 0) goto LAB_0015b5c9;
    if (fail_cb_called != 1) goto LAB_0015b5ce;
    pcStack_e8 = (code *)0x15b585;
    unaff_RBX = (char **)uv_default_loop();
    pcStack_e8 = (code *)0x15b599;
    uv_walk(unaff_RBX,close_walk_cb,0);
    iVar2 = 0;
    pcStack_e8 = (code *)0x15b5a3;
    uv_run(unaff_RBX);
    pcStack_e8 = (code *)0x15b5a8;
    uVar5 = uv_default_loop();
    pcStack_e8 = (code *)0x15b5b0;
    iVar3 = uv_loop_close(uVar5);
    if (iVar3 == 0) {
      return 0;
    }
  }
  else {
    pcStack_e8 = (code *)0x15b5c4;
    run_test_getaddrinfo_fail_cold_1();
LAB_0015b5c4:
    pcStack_e8 = (code *)0x15b5c9;
    run_test_getaddrinfo_fail_cold_2();
LAB_0015b5c9:
    pcStack_e8 = (code *)0x15b5ce;
    run_test_getaddrinfo_fail_cold_3();
LAB_0015b5ce:
    pcStack_e8 = (code *)0x15b5d3;
    run_test_getaddrinfo_fail_cold_4();
  }
  pcStack_e8 = getaddrinfo_fail_cb;
  run_test_getaddrinfo_fail_cold_5();
  if (fail_cb_called == 0) {
    if (-1 < iVar2) goto LAB_0015b5ff;
    if (extraout_RDX == 0) {
      ppcStack_f0 = (char **)0x15b5f2;
      pcStack_e8._0_4_ = extraout_EAX;
      uv_freeaddrinfo(0);
      fail_cb_called = fail_cb_called + 1;
      return (int)pcStack_e8;
    }
  }
  else {
    ppcStack_f0 = (char **)0x15b5ff;
    getaddrinfo_fail_cb_cold_1();
LAB_0015b5ff:
    ppcStack_f0 = (char **)0x15b604;
    getaddrinfo_fail_cb_cold_2();
  }
  ppcStack_f0 = (char **)run_test_getaddrinfo_fail_sync;
  getaddrinfo_fail_cb_cold_3();
  ppcStack_198 = (char **)0x15b616;
  ppcStack_f0 = unaff_RBX;
  uVar5 = uv_default_loop();
  ppcStack_198 = (char **)0x15b630;
  iVar2 = uv_getaddrinfo(uVar5,auStack_190,0,"xyzzy.xyzzy.xyzzy.",0,0);
  if (iVar2 < 0) {
    ppcStack_198 = (char **)0x15b641;
    uv_freeaddrinfo(uStack_100);
    ppcStack_198 = (char **)0x15b646;
    unaff_RBX = (char **)uv_default_loop();
    ppcStack_198 = (char **)0x15b65a;
    uv_walk(unaff_RBX,close_walk_cb,0);
    ppcStack_198 = (char **)0x15b664;
    uv_run(unaff_RBX,0);
    ppcStack_198 = (char **)0x15b669;
    uVar5 = uv_default_loop();
    ppcStack_198 = (char **)0x15b671;
    iVar2 = uv_loop_close(uVar5);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    ppcStack_198 = (char **)0x15b685;
    run_test_getaddrinfo_fail_sync_cold_1();
  }
  ppcStack_198 = (char **)run_test_getaddrinfo_basic;
  run_test_getaddrinfo_fail_sync_cold_2();
  ppcStack_1a0 = (char **)0x15b695;
  ppcStack_198 = unaff_RBX;
  getaddrinfo_handle = (uv_getaddrinfo_t *)malloc(0xa0);
  ppcStack_1a0 = (char **)0x15b6a1;
  puVar6 = (uv_getaddrinfo_t *)uv_default_loop();
  ppcStack_1a0 = (char **)0x15b6c4;
  iVar2 = uv_getaddrinfo(puVar6,getaddrinfo_handle,getaddrinfo_basic_cb,"localhost",0,0);
  if (iVar2 == 0) {
    ppcStack_1a0 = (char **)0x15b6cd;
    puVar6 = (uv_getaddrinfo_t *)uv_default_loop();
    ppcStack_1a0 = (char **)0x15b6d7;
    uv_run(puVar6,0);
    if (getaddrinfo_cbs != 1) goto LAB_0015b71d;
    ppcStack_1a0 = (char **)0x15b6e5;
    unaff_RBX = (char **)uv_default_loop();
    ppcStack_1a0 = (char **)0x15b6f9;
    uv_walk(unaff_RBX,close_walk_cb,0);
    ppcStack_1a0 = (char **)0x15b703;
    uv_run(unaff_RBX,0);
    ppcStack_1a0 = (char **)0x15b708;
    puVar6 = (uv_getaddrinfo_t *)uv_default_loop();
    ppcStack_1a0 = (char **)0x15b710;
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    ppcStack_1a0 = (char **)0x15b71d;
    run_test_getaddrinfo_basic_cold_1();
LAB_0015b71d:
    ppcStack_1a0 = (char **)0x15b722;
    run_test_getaddrinfo_basic_cold_2();
  }
  ppcStack_1a0 = (char **)getaddrinfo_basic_cb;
  run_test_getaddrinfo_basic_cold_3();
  ppcStack_1a0 = unaff_RBX;
  if (getaddrinfo_handle == puVar6) {
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    ppcStack_1a8 = (char **)0x15b73f;
    free(puVar6);
    iVar2 = uv_freeaddrinfo(extraout_RDX_00);
    return iVar2;
  }
  ppcStack_1a8 = (char **)run_test_getaddrinfo_basic_sync;
  getaddrinfo_basic_cb_cold_1();
  ppcStack_1a8 = unaff_RBX;
  uVar5 = uv_default_loop();
  iVar2 = uv_getaddrinfo(uVar5,auStack_248,0,"localhost",0,0);
  if (iVar2 == 0) {
    uv_freeaddrinfo(uStack_1b8);
    unaff_RBX = (char **)uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,0);
    uv_run(unaff_RBX,0);
    uVar5 = uv_default_loop();
    iVar2 = uv_loop_close(uVar5);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_getaddrinfo_basic_sync_cold_1();
  }
  run_test_getaddrinfo_basic_sync_cold_2();
  puVar6 = getaddrinfo_handles;
  piVar11 = callback_counts;
  lVar12 = 0;
  do {
    *piVar11 = 0;
    puVar10 = (undefined8 *)0x4;
    puVar7 = (undefined4 *)malloc(4);
    if (puVar7 == (undefined4 *)0x0) {
      run_test_getaddrinfo_concurrent_cold_4();
LAB_0015b8bc:
      run_test_getaddrinfo_concurrent_cold_1();
      goto LAB_0015b8c1;
    }
    *puVar7 = (int)lVar12;
    puVar6->data = puVar7;
    puVar10 = (undefined8 *)uv_default_loop();
    iVar2 = uv_getaddrinfo(puVar10,puVar6,getaddrinfo_cuncurrent_cb,"localhost",0,0,unaff_RBX);
    if (iVar2 != 0) goto LAB_0015b8bc;
    lVar12 = lVar12 + 1;
    puVar6 = puVar6 + 1;
    piVar11 = piVar11 + 1;
  } while (lVar12 != 10);
  puVar10 = (undefined8 *)uv_default_loop();
  lVar12 = 0;
  uv_run(puVar10,0);
  do {
    if (*(int *)((long)callback_counts + lVar12) != 1) goto LAB_0015b8c1;
    lVar12 = lVar12 + 4;
  } while (lVar12 != 0x28);
  uVar5 = uv_default_loop();
  uv_walk(uVar5,close_walk_cb,0);
  uv_run(uVar5,0);
  puVar10 = (undefined8 *)uv_default_loop();
  iVar2 = uv_loop_close();
  if (iVar2 == 0) {
    return 0;
  }
LAB_0015b8c6:
  run_test_getaddrinfo_concurrent_cold_3();
  piVar11 = (int *)*puVar10;
  piVar8 = callback_counts;
  psVar9 = &closedir_req.bufsml[1].len;
  lVar12 = 0;
  do {
    psVar9 = psVar9 + 0x14;
    if (psVar9 == puVar10) goto LAB_0015b903;
    piVar8 = piVar8 + 1;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 10);
  getaddrinfo_cuncurrent_cb_cold_1();
  lVar12 = extraout_RDX_02;
LAB_0015b903:
  if (*piVar11 == (int)lVar12) {
    *piVar8 = *piVar8 + 1;
    free(piVar11);
    iVar2 = uv_freeaddrinfo(extraout_RDX_01);
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    return iVar2;
  }
  getaddrinfo_cuncurrent_cb_cold_2();
  iVar2 = uv_is_closing();
  if (iVar2 != 0) {
    return iVar2;
  }
  iVar2 = uv_close(piVar11,0);
  return iVar2;
LAB_0015b8c1:
  run_test_getaddrinfo_concurrent_cold_2();
  goto LAB_0015b8c6;
}

Assistant:

TEST_IMPL(get_passwd) {
  uv_passwd_t pwd;
  size_t len;
  int r;

  /* Test the normal case */
  r = uv_os_get_passwd(&pwd);
  ASSERT(r == 0);
  len = strlen(pwd.username);
  ASSERT(len > 0);

#ifdef _WIN32
  ASSERT(pwd.shell == NULL);
#else
  len = strlen(pwd.shell);
  ASSERT(len > 0);
#endif

  len = strlen(pwd.homedir);
  ASSERT(len > 0);

#ifdef _WIN32
  if (len == 3 && pwd.homedir[1] == ':')
    ASSERT(pwd.homedir[2] == '\\');
  else
    ASSERT(pwd.homedir[len - 1] != '\\');
#else
  if (len == 1)
    ASSERT(pwd.homedir[0] == '/');
  else
    ASSERT(pwd.homedir[len - 1] != '/');
#endif

#ifdef _WIN32
  ASSERT(pwd.uid == -1);
  ASSERT(pwd.gid == -1);
#else
  ASSERT(pwd.uid >= 0);
  ASSERT(pwd.gid >= 0);
#endif

  /* Test uv_os_free_passwd() */
  uv_os_free_passwd(&pwd);

  ASSERT(pwd.username == NULL);
  ASSERT(pwd.shell == NULL);
  ASSERT(pwd.homedir == NULL);

  /* Test a double free */
  uv_os_free_passwd(&pwd);

  ASSERT(pwd.username == NULL);
  ASSERT(pwd.shell == NULL);
  ASSERT(pwd.homedir == NULL);

  /* Test invalid input */
  r = uv_os_get_passwd(NULL);
  ASSERT(r == UV_EINVAL);

  return 0;
}